

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_data_reader.cpp
# Opt level: O3

void __thiscall duckdb::TableDataReader::ReadTableData(TableDataReader *this)

{
  MetadataReader *pMVar1;
  pointer pCVar2;
  pointer pPVar3;
  MetaBlockPointer MVar4;
  unsigned_long value;
  BinaryDeserializer stats_deserializer;
  idx_t local_2c0;
  BinaryDeserializer local_2b8;
  
  pCVar2 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&this->info->base);
  pMVar1 = this->reader;
  local_2b8.super_Deserializer._vptr_Deserializer = (_func_int **)&PTR__Deserializer_01967a98;
  local_2b8.super_Deserializer.deserialize_enum_from_string = false;
  SerializationData::SerializationData(&local_2b8.super_Deserializer.data);
  local_2b8.super_Deserializer._vptr_Deserializer = (_func_int **)&PTR__Deserializer_019678f8;
  local_2b8.nesting_level = 0;
  local_2b8.has_buffered_field = false;
  local_2b8.buffered_field = 0;
  local_2b8.super_Deserializer.deserialize_enum_from_string = false;
  local_2b8.stream = &pMVar1->super_ReadStream;
  BinaryDeserializer::OnObjectBegin(&local_2b8);
  pPVar3 = unique_ptr<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>,_true>
           ::operator->(&this->info->data);
  TableStatistics::Deserialize
            (&pPVar3->table_stats,&local_2b8.super_Deserializer,
             (ColumnList *)&pCVar2[1].catalog.field_2);
  BinaryDeserializer::OnObjectEnd(&local_2b8);
  (**(this->reader->super_ReadStream)._vptr_ReadStream)(this->reader,&local_2c0,8);
  pPVar3 = unique_ptr<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>,_true>
           ::operator->(&this->info->data);
  pPVar3->row_group_count = local_2c0;
  MVar4 = MetadataReader::GetMetaBlockPointer(this->reader);
  pPVar3 = unique_ptr<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>,_true>
           ::operator->(&this->info->data);
  pPVar3->block_pointer = MVar4;
  Deserializer::~Deserializer(&local_2b8.super_Deserializer);
  return;
}

Assistant:

void TableDataReader::ReadTableData() {
	auto &columns = info.Base().columns;
	D_ASSERT(!columns.empty());

	// We stored the table statistics as a unit in FinalizeTable.
	BinaryDeserializer stats_deserializer(reader);
	stats_deserializer.Begin();
	info.data->table_stats.Deserialize(stats_deserializer, columns);
	stats_deserializer.End();

	// Deserialize the row group pointers (lazily, just set the count and the pointer to them for now)
	info.data->row_group_count = reader.Read<uint64_t>();
	info.data->block_pointer = reader.GetMetaBlockPointer();
}